

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaBlockMetadata_TLSF::~VmaBlockMetadata_TLSF(VmaBlockMetadata_TLSF *this)

{
  (this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata =
       (_func_int **)&PTR__VmaBlockMetadata_TLSF_00323008;
  if (this->m_FreeList != (Block **)0x0) {
    VmaFree((this->super_VmaBlockMetadata).m_pAllocationCallbacks,this->m_FreeList);
  }
  VmaBlockBufferImageGranularity::Destroy
            (&this->m_GranularityHandler,(this->super_VmaBlockMetadata).m_pAllocationCallbacks);
  VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::~VmaPoolAllocator(&this->m_BlockAllocator);
  return;
}

Assistant:

VmaBlockMetadata_TLSF::~VmaBlockMetadata_TLSF()
{
    if (m_FreeList)
        vma_delete_array(GetAllocationCallbacks(), m_FreeList, m_ListsCount);
    m_GranularityHandler.Destroy(GetAllocationCallbacks());
}